

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O0

int x25519_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  ptls_key_exchange_context_t *ppVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_40;
  size_t local_38;
  st_x25519_key_exchange_t *ctx;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  ppVar1 = (ptls_key_exchange_context_t *)malloc(0x60);
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    algo_local._4_4_ = 0x201;
  }
  else {
    pVar2 = ptls_iovec_init(ppVar1 + 2,0x20);
    ppVar1->algo = algo;
    local_40 = pVar2.base;
    (ppVar1->pubkey).base = local_40;
    local_38 = pVar2.len;
    (ppVar1->pubkey).len = local_38;
    ppVar1->on_exchange = x25519_on_exchange;
    x25519_create_keypair((uint8_t *)(ppVar1 + 1),(uint8_t *)(ppVar1 + 2));
    *_ctx = ppVar1;
    algo_local._4_4_ = 0;
  }
  return algo_local._4_4_;
}

Assistant:

static int x25519_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    struct st_x25519_key_exchange_t *ctx;

    if ((ctx = (struct st_x25519_key_exchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){algo, ptls_iovec_init(ctx->pub, sizeof(ctx->pub)), x25519_on_exchange};
    x25519_create_keypair(ctx->priv, ctx->pub);

    *_ctx = &ctx->super;
    return 0;
}